

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cc
# Opt level: O0

MatrixXd * Util::LoadDatFile(string *file,int rows,int cols)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  runtime_error *this;
  int in_ECX;
  int in_EDX;
  string *in_RSI;
  MatrixXd *in_RDI;
  int colidx;
  stringstream ss;
  int rowidx;
  size_type sz;
  string word;
  string line;
  ifstream myFile;
  MatrixXd *dat;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *in_stack_fffffffffffffb88;
  string *in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffb9c;
  int local_42c;
  stringstream local_428 [396];
  int local_29c;
  string local_290 [32];
  string local_270 [48];
  istream local_240 [551];
  byte local_19;
  int local_18;
  int local_14;
  
  local_19 = 0;
  local_18 = in_ECX;
  local_14 = in_EDX;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
            (CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
             (Index)in_stack_fffffffffffffb90);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffb90,
             in_stack_fffffffffffffb88);
  std::ifstream::ifstream(local_240,in_RSI,_S_in);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Could not open file");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string(local_270);
  std::__cxx11::string::string(local_290);
  for (local_29c = 0; local_29c < local_14; local_29c = local_29c + 1) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>(local_240,local_270);
    _Var2 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream(local_428,local_270,_Var2);
    for (local_42c = 0; local_42c < local_18; local_42c = local_42c + 1) {
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_428,local_290,',');
      in_stack_fffffffffffffb90 =
           (string *)
           std::__cxx11::stod(in_stack_fffffffffffffb90,(size_t *)in_stack_fffffffffffffb88);
      in_stack_fffffffffffffb88 =
           (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
            *)Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                         in_stack_fffffffffffffb90,(Index)in_stack_fffffffffffffb88,0x131d12);
      *(string **)in_stack_fffffffffffffb88 = in_stack_fffffffffffffb90;
    }
    std::__cxx11::stringstream::~stringstream(local_428);
  }
  local_19 = 1;
  std::__cxx11::string::~string(local_290);
  std::__cxx11::string::~string(local_270);
  std::ifstream::~ifstream(local_240);
  if ((local_19 & 1) == 0) {
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x131df7)
    ;
  }
  return in_RDI;
}

Assistant:

Eigen::MatrixXd LoadDatFile(std::string file, int rows, int cols){

		//initialize the matrix
		Eigen::MatrixXd dat = Eigen::MatrixXd::Zero(rows, cols);

		//create input filestream
		std::ifstream myFile(file);

		// Make sure the file is open
		if(!myFile.is_open()) throw std::runtime_error("Could not open file");

		//line and word string
		std::string line;
		std::string word;
		std::string::size_type sz;     // alias of size_t

		// cycle
	    for (int rowidx = 0; rowidx < rows; ++rowidx) {

	    	//get line and create string stream
	    	std::getline(myFile, line);
	    	std::stringstream ss(line);
	    	
	    	for (int colidx = 0; colidx < cols; ++colidx) {

	    		//extract
	    		std::getline(ss, word, ',');

	    		dat(rowidx,colidx) = std::stod(word, &sz);
	    		
	    	}
	    }

	    //output
	    return dat;


	}